

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_sequential_encoder.cc
# Opt level: O0

Status * __thiscall
draco::PointCloudSequentialEncoder::EncodeGeometryData(PointCloudSequentialEncoder *this)

{
  PointCloud *this_00;
  PointCloudEncoder *in_RSI;
  EncoderBuffer *in_RDI;
  int32_t num_points;
  PointCloudEncoder *data;
  EncoderBuffer *this_01;
  
  data = in_RSI;
  this_01 = in_RDI;
  this_00 = PointCloudEncoder::point_cloud(in_RSI);
  PointCloud::num_points(this_00);
  PointCloudEncoder::buffer(in_RSI);
  EncoderBuffer::Encode<int>(this_01,(int *)data);
  OkStatus();
  return (Status *)in_RDI;
}

Assistant:

Status PointCloudSequentialEncoder::EncodeGeometryData() {
  const int32_t num_points = point_cloud()->num_points();
  buffer()->Encode(num_points);
  return OkStatus();
}